

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkMoveNames(Abc_Ntk_t *pNtk,Abc_Ntk_t *pOld)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  long *plVar3;
  Nm_Man_t *pNVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  Nm_ManFree(pNtk->pManName);
  pNVar4 = Nm_ManCreate(pNtk->vCos->nSize + pNtk->vCis->nSize + pNtk->vBoxes->nSize);
  pNtk->pManName = pNVar4;
  pVVar6 = pNtk->vPis;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      if (pOld->vPis->nSize <= lVar7) goto LAB_00865256;
      pAVar1 = (Abc_Obj_t *)pVVar6->pArray[lVar7];
      plVar2 = (long *)pOld->vPis->pArray[lVar7];
      pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2]);
      Abc_ObjAssignName(pAVar1,pcVar5,(char *)0x0);
      lVar7 = lVar7 + 1;
      pVVar6 = pNtk->vPis;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vPos;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      if (pOld->vPos->nSize <= lVar7) goto LAB_00865256;
      pAVar1 = (Abc_Obj_t *)pVVar6->pArray[lVar7];
      plVar2 = (long *)pOld->vPos->pArray[lVar7];
      pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2]);
      Abc_ObjAssignName(pAVar1,pcVar5,(char *)0x0);
      lVar7 = lVar7 + 1;
      pVVar6 = pNtk->vPos;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vBoxes;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      plVar2 = (long *)pVVar6->pArray[lVar7];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        if (pOld->vBoxes->nSize <= lVar7) {
LAB_00865256:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar1 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        plVar3 = (long *)pOld->vBoxes->pArray[lVar7];
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar3 + 0x18),(int)plVar3[2]);
        Abc_ObjAssignName(pAVar1,pcVar5,(char *)0x0);
        if (pOld->vBoxes->nSize <= lVar7) goto LAB_00865256;
        pAVar1 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        plVar2 = (long *)pOld->vBoxes->pArray[lVar7];
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2]);
        Abc_ObjAssignName(pAVar1,pcVar5,(char *)0x0);
        pVVar6 = pNtk->vBoxes;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar6->nSize);
  }
  Abc_NtkRedirectCiCo(pNtk);
  return;
}

Assistant:

void Abc_NtkMoveNames( Abc_Ntk_t * pNtk, Abc_Ntk_t * pOld )
{
    Abc_Obj_t * pObj; int i;
    Nm_ManFree( pNtk->pManName );
    pNtk->pManName = Nm_ManCreate( Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk) + Abc_NtkBoxNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjName(Abc_NtkPi(pOld, i)), NULL );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjName(Abc_NtkPo(pOld, i)), NULL );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_ObjFanin0(pObj),  Abc_ObjName(Abc_ObjFanin0(Abc_NtkBox(pOld, i))),  NULL );
        Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjName(Abc_ObjFanout0(Abc_NtkBox(pOld, i))), NULL );
    }
    Abc_NtkRedirectCiCo( pNtk );
}